

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# engine.cpp
# Opt level: O3

char * rw::strdup_LOC(char *s,uint32 hint,char *here)

{
  size_t sVar1;
  void *__dest;
  char *pcVar2;
  
  sVar1 = strlen(s);
  allocLocation = here;
  __dest = (void *)(*Engine::memfuncs)(sVar1 + 1,hint);
  if (__dest != (void *)0x0) {
    pcVar2 = (char *)memcpy(__dest,s,sVar1 + 1);
    return pcVar2;
  }
  return (char *)0x0;
}

Assistant:

char *strdup_LOC(const char *s, uint32 hint, const char *here) {
	char *t;
	size_t sz = strlen(s)+1;
	t = (char*)malloc_LOC(sz, hint, here);
	if(t)
		memcpy(t, s, sz);
	return t;
}